

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KEncodersDecoders.h
# Opt level: O0

void __thiscall KDIS::NetToDataType<float>::SwapBytes(NetToDataType<float> *this)

{
  ushort local_1a;
  ushort local_18;
  ushort local_16;
  NetToDataType<float> aNStack_14 [2];
  KUINT16 i_1;
  KUINT16 j;
  KUINT16 i;
  KOCTET Temp [4];
  NetToDataType<float> *this_local;
  
  _j = this;
  for (local_16 = 0; local_16 < 4; local_16 = local_16 + 1) {
    aNStack_14[local_16] = this[local_16];
  }
  local_18 = 3;
  for (local_1a = 0; local_1a < 4; local_1a = local_1a + 1) {
    this[local_1a] = aNStack_14[local_18];
    local_18 = local_18 - 1;
  }
  return;
}

Assistant:

void SwapBytes()
    {
        KOCTET Temp[sizeof( DataType )];

        // Copy Data To temp;
        for( KUINT16 i = 0; i < sizeof( DataType ); ++i )
        {
            Temp[i] = m_Octs[i];
        }

        // Now swap bytes
        KUINT16 j = ( sizeof( DataType ) ) - 1 ;

        for( KUINT16 i = 0; i < sizeof( DataType ); ++i )
        {
            m_Octs[i] = Temp[j];
            --j;
        }
    }